

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall TTD::TTEventList::RemoveArrayLink(TTEventList *this,TTEventListLink *block)

{
  TTEventList *pTVar1;
  
  if (block->Previous != (TTEventListLink *)0x0) {
    TTDAbort_unrecoverable_error("Not first event block in log!!!");
  }
  if (block->StartPos == block->CurrPos) {
    pTVar1 = (TTEventList *)&block->Next->Previous;
    if (block->Next == (TTEventListLink *)0x0) {
      pTVar1 = this;
    }
    pTVar1->m_headBlock = (TTEventListLink *)0x0;
    SlabAllocatorBase<8>::UnlinkAllocation(this->m_alloc,block->BlockData);
    SlabAllocatorBase<8>::UnlinkAllocation(this->m_alloc,block);
    return;
  }
  TTDAbort_unrecoverable_error("Haven\'t cleared all the events in this link");
}

Assistant:

void TTEventList::RemoveArrayLink(TTEventListLink* block)
    {
        TTDAssert(block->Previous == nullptr, "Not first event block in log!!!");
        TTDAssert(block->StartPos == block->CurrPos, "Haven't cleared all the events in this link");

        if(block->Next == nullptr)
        {
            this->m_headBlock = nullptr; //was only 1 block to we are now all null
        }
        else
        {
            block->Next->Previous = nullptr;
        }

        this->m_alloc->UnlinkAllocation(block->BlockData);
        this->m_alloc->UnlinkAllocation(block);
    }